

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * parasail_pack_fastq_buffer(char *T,off_t size,long *packed_size)

{
  bool bVar1;
  parasail_file_stat_t *__ptr;
  long lVar2;
  off_t oVar3;
  bool bVar4;
  parasail_file_stat_t *pfs;
  unsigned_long line;
  off_t w;
  off_t i;
  int first;
  char *P;
  long *packed_size_local;
  off_t size_local;
  char *T_local;
  
  bVar1 = true;
  w = 0;
  line = 0;
  pfs = (parasail_file_stat_t *)0x0;
  if (T == (char *)0x0) {
    fprintf(_stderr,"parasail_pack_fastq_buffer: NULL pointer\n");
    T_local = (char *)0x0;
  }
  else if (packed_size == (long *)0x0) {
    fprintf(_stderr,"parasail_pack_fastq_buffer: NULL size pointer\n");
    T_local = (char *)0x0;
  }
  else {
    __ptr = parasail_stat_fastq_buffer(T,size);
    if (__ptr == (parasail_file_stat_t *)0x0) {
      fprintf(_stderr,"parasail_stat_fastq_buffer: fastq stat failed\n");
      T_local = (char *)0x0;
    }
    else {
      T_local = (char *)malloc(__ptr->characters + __ptr->sequences + 1);
      if (T_local == (char *)0x0) {
        perror("malloc");
        fprintf(_stderr,"parasail_pack_fastq_buffer: malloc failed\n");
        free(__ptr);
        T_local = (char *)0x0;
      }
      else {
        free(__ptr);
        while (w < size) {
          if (T[w] != '@') {
            fprintf(_stderr,"parasail_pack_fastq_buffer: poorly formatted FASTQ file, line %lu\n",
                    pfs);
            free(T_local);
            return (char *)0x0;
          }
          if (bVar1) {
            bVar1 = false;
          }
          else {
            T_local[line] = '$';
            line = line + 1;
          }
          lVar2 = skip_line(T,w);
          while( true ) {
            w = lVar2 + 1;
            bVar4 = false;
            if (T[w] != '\n') {
              bVar4 = T[w] != '\r';
            }
            if (!bVar4) break;
            T_local[line] = T[w];
            line = line + 1;
            lVar2 = w;
          }
          if ((lVar2 + 2 < size) && ((T[lVar2 + 2] == '\n' || (T[lVar2 + 2] == '\r')))) {
            w = lVar2 + 2;
          }
          if (T[w + 1] != '+') {
            fprintf(_stderr,"parasail_pack_fastq_buffer: poorly formatted FASTQ file, line %lu\n",
                    (undefined1 *)((long)&pfs->sequences + 2));
            free(T_local);
            return (char *)0x0;
          }
          oVar3 = skip_line(T,w + 1);
          oVar3 = skip_line(T,oVar3 + 1);
          pfs = (parasail_file_stat_t *)((long)&pfs->sequences + 4);
          w = oVar3 + 1;
        }
        T_local[line] = '$';
        T_local[line + 1] = '\0';
        *packed_size = line + 1;
      }
    }
  }
  return T_local;
}

Assistant:

char * parasail_pack_fastq_buffer(const char *T, off_t size, long * packed_size)
{
    char *P = NULL;
    int first = 1;
    off_t i = 0;
    off_t w = 0;
    unsigned long line = 0;
    parasail_file_stat_t *pfs = NULL;

    if (NULL == T) {
        fprintf(stderr, "parasail_pack_fastq_buffer: NULL pointer\n");
        return NULL;
    }

    if (NULL == packed_size) {
        fprintf(stderr, "parasail_pack_fastq_buffer: NULL size pointer\n");
        return NULL;
    }

    pfs = parasail_stat_fastq_buffer(T, size);
    if (NULL == pfs) {
        fprintf(stderr, "parasail_stat_fastq_buffer: fastq stat failed\n");
        return NULL;
    }

    P = (char*)malloc(sizeof(char) * (pfs->characters+pfs->sequences+1));
    if (NULL == P) {
        perror("malloc");
        fprintf(stderr, "parasail_pack_fastq_buffer: malloc failed\n");
        free(pfs);
        return NULL;
    }
    free(pfs);

    /* read file */
    while (i<size) {
        if (T[i] != '@') {
            fprintf(stderr, "parasail_pack_fastq_buffer: "
                    "poorly formatted FASTQ file, line %lu\n", line);
            free(P);
            return NULL;
        }

        /* encountered a new sequence */
        if (first) {
            first = 0;
        }
        else {
            P[w++] = '$';
        }

        i = skip_line(T, i);

        /* go to next line */
        ++i;
        ++line;

        /* rest of next line is the sequence */
        while (T[i] != '\n' && T[i] != '\r') {
            P[w++] = T[i];
            ++i;
        }

        /* for the case of "\r\n" or "\n\r" */
        if (i+1<size && (T[i+1] == '\n' || T[i+1] == '\r')) {
            ++i;
        }

        /* go to next line */
        ++i;
        ++line;

        if (T[i] != '+') {
            fprintf(stderr, "parasail_pack_fastq_buffer: "
                    "poorly formatted FASTQ file, line %lu\n", line);
            free(P);
            return NULL;
        }

        i = skip_line(T, i);

        /* go to next line */
        ++i;
        ++line;

        /* rest of next line are the quality control values */
        i = skip_line(T, i);

        /* go to next line */
        ++i;
        ++line;
    }

    P[w++] = '$';
    P[w] = '\0';
    *packed_size = w;
    return P;
}